

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

int writesimage(fitsfile *fptr,int *status)

{
  int iVar1;
  int *in_RSI;
  fitsfile *in_RDI;
  long naxes [2];
  long naxis;
  int bitpix;
  double elapse;
  float cpufrac;
  float elapcpu;
  float size;
  float rate;
  long ii;
  long nremain;
  int *status_00;
  fitsfile *fptr_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  float *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  long nelem;
  long firstelem;
  
  uVar2 = 0x10;
  fptr_00 = (fitsfile *)0x2;
  status_00 = (int *)0xbb8;
  iVar1 = ffcrim((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (int)in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                 (long *)in_stack_ffffffffffffffc8,(int *)CONCAT44(0x10,in_stack_ffffffffffffffc0));
  if (iVar1 != 0) {
    printerror(elapse._4_4_);
  }
  printf("\nWrite %dx%d I*2 image, %d pixels/loop:   ",3000,3000,20000);
  marktime((int *)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
  firstelem = 9000000;
  for (nelem = 1; nelem <= firstelem; nelem = nelem + 20000) {
    ffppri(in_RDI,(long)in_RSI,firstelem,nelem,
           (short *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
           (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  ffflus(fptr_00,status_00);
  gettime((double *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffc8,(int *)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
  printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0x4032000000000000,in_stack_ffffffffffffffc8,
         (double)(float)(((double)in_stack_ffffffffffffffd4 / (double)in_stack_ffffffffffffffc8) *
                        100.0),(double)(float)(18.0 / (double)in_stack_ffffffffffffffc8));
  return *in_RSI;
}

Assistant:

int writesimage(fitsfile *fptr, int *status)

    /**************************************************/
    /* write the primary array containing a 2-D image */
    /**************************************************/
{
    long  nremain, ii;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    /* initialize FITS image parameters */
    int bitpix   =  16;   /* 16-bit  signed integer pixel values       */
    long naxis    =   2;  /* 2-dimensional image                            */    
    long naxes[2] = {XSIZE, YSIZE }; /* image size */

    /* write the required keywords for the primary array image */
    if ( fits_create_img(fptr, bitpix, naxis, naxes, status) )
         printerror( *status );          

    printf("\nWrite %dx%d I*2 image, %d pixels/loop:   ",XSIZE,YSIZE,SHTSIZE);
    marktime(status);

    nremain = XSIZE * YSIZE;
    for (ii = 1; ii <= nremain; ii += SHTSIZE)
    {
      ffppri(fptr, 0, ii, SHTSIZE, ssarray, status);
    }

    ffflus(fptr, status);  /* flush all buffers to disk */

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = XSIZE * 2. * YSIZE / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}